

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void rsvd(double *A,int M,int N,int K,int oversample,int n_iter,double *U,double *V,double *S)

{
  long lVar1;
  time_t tVar2;
  long lVar3;
  double *values;
  double *C;
  double *col;
  int *ipiv;
  double *R;
  double *bvec;
  double *U_00;
  double *V_00;
  double *q;
  int iVar4;
  int p;
  size_t sVar5;
  size_t __size;
  ulong uVar6;
  ulong uVar7;
  
  if (n_iter == 0) {
    puts(
        "Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS "
        );
  }
  else {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    if (N <= M) {
      p = oversample + K;
      lVar1 = (long)M * 8;
      lVar3 = (long)p;
      sVar5 = lVar1 * lVar3;
      values = (double *)malloc(sVar5);
      C = (double *)malloc(sVar5);
      col = (double *)malloc(lVar1 * N);
      ipiv = (int *)malloc((long)M << 2);
      sVar5 = lVar3 * 8;
      __size = lVar3 * sVar5;
      R = (double *)malloc(__size);
      bvec = (double *)malloc(__size);
      U_00 = (double *)malloc(__size);
      V_00 = (double *)malloc((long)N * sVar5);
      q = (double *)malloc(sVar5);
      marsaglia_generate(values,p * N,0.0,1.0);
      mtranspose(A,M,N,col);
      iVar4 = 5;
      if (-1 < n_iter) {
        iVar4 = n_iter;
      }
      do {
        mmult(A,values,C,M,N,p);
        rludecomp(C,M,p,ipiv);
        getPU(C,M,p,ipiv,values,(double *)0x0);
        mmult(col,values,C,N,M,p);
        rludecomp(C,N,p,ipiv);
        getPU(C,N,p,ipiv,values,(double *)0x0);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      mmult(A,values,C,M,N,p);
      qrdecomp(C,M,p,bvec);
      getQR(C,M,p,bvec,values,R);
      mtranspose(values,M,p,C);
      mmult(C,A,values,p,M,N);
      svd_transpose(values,p,N,U_00,V_00,q);
      if (0 < N) {
        uVar7 = (ulong)(uint)N;
        uVar6 = 0;
        iVar4 = 0;
        do {
          if (0 < K) {
            memcpy(V + uVar6,V_00 + iVar4,(ulong)(uint)K * 8);
          }
          iVar4 = iVar4 + p;
          uVar6 = (ulong)(uint)((int)uVar6 + K);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      memcpy(S,q,(long)K << 3);
      itranspose(C,p,M);
      mmult(C,U_00,values,M,p,p);
      if (0 < M) {
        uVar7 = (ulong)(uint)M;
        uVar6 = 0;
        iVar4 = 0;
        do {
          if (0 < K) {
            memcpy(U + uVar6,values + iVar4,(ulong)(uint)K << 3);
          }
          iVar4 = iVar4 + p;
          uVar6 = (ulong)(uint)((int)uVar6 + K);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      free(values);
      free(C);
      free(ipiv);
      free(col);
      free(R);
      free(bvec);
      free(U_00);
      free(V_00);
      free(q);
      return;
    }
    printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
  }
  exit(-1);
}

Assistant:

void rsvd(double *A, int M, int N,int K, int oversample, int n_iter,double *U, double *V, double *S) {
	/*
	A - MXN matrix
	K - Rank of approximation being constructed. K <= min(m,n). default value 6
	L - block size of the normalized power iterations. Default K+2
	n_iter - number of normalized power iterations to conduct. Default 2
	U - MXK
	V - NXK
	S - Diagonal Matrix KXK
	*/

	if (n_iter == 0) {
		printf("Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS \n");
		exit(-1);
	}
	else if (n_iter < 0) {
		n_iter = (int)RSVD_POWER_ITERATIONS;
	}

	int i, j,maxdim,L;
	double *Q1,*Q2,*AT,*R,*bvec,*uq,*vq,*sq;
	int *ipiv;

	L = K + oversample;

	maxdim = M > N ? M : N;
	srand(time(NULL));

	if (M >= N) {

		Q1 = (double*)malloc(sizeof(double)*maxdim*L);
		Q2 = (double*)malloc(sizeof(double)*maxdim*L);
		AT = (double*)malloc(sizeof(double)*M*N);
		ipiv = (int*)malloc(sizeof(int)*maxdim);
		R = (double*)malloc(sizeof(double)*L*L);
		bvec = (double*)malloc(sizeof(double)*L*L);

		uq = (double*)malloc(sizeof(double)*L*L);
		vq = (double*)malloc(sizeof(double)*L*N);
		sq = (double*)malloc(sizeof(double)*L);

		random_matrix(Q1, N, L);// N*L
		
		mtranspose(A, M, N, AT);

		for (i = 0; i < n_iter; ++i) {
			mmult(A, Q1, Q2, M, N, L);// M*L
			rludecomp(Q2, M, L, ipiv);
			getPU(Q2, M, L, ipiv, Q1, NULL);// M*L
			mmult(AT, Q1, Q2, N, M, L);//N*L
			rludecomp(Q2, N, L, ipiv);
			getPU(Q2, N, L, ipiv, Q1, NULL);// N*L
		}

		mmult(A, Q1, Q2, M, N, L);
		qrdecomp(Q2, M, L, bvec);
		getQR(Q2, M, L, bvec, Q1, R);// M*L

		mtranspose(Q1, M, L, Q2);// L*M
		mmult(Q2, A, Q1, L, M, N);// L* N

		svd_transpose(Q1, L, N, uq, vq, sq);
		// uq - LXL
		// vq - NXL
		//itranspose(vq, N, L);

		for (i = 0; i < N; ++i) {
			for (j = 0; j < K; ++j) {
				V[i*K + j] = vq[i*L + j];
			}
		}

		memcpy(S, sq, sizeof(double)*K);
		
		itranspose(Q2, L, M);

		mmult(Q2, uq, Q1, M, L, L);

		for (i = 0; i < M; ++i) {
			for (j = 0; j < K; ++j) {
				U[i*K + j] = Q1[i*L + j];
			}
		}

		free(Q1);
		free(Q2);
		free(ipiv);
		free(AT);
		free(R);
		free(bvec);
		free(uq);
		free(vq);
		free(sq);

	}
	else {
		printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
		exit(-1);
	}

}